

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

DecodeStatus DecodeFPR64RegisterClass(MCInst *Inst,uint RegNo,uint64_t Addr,void *Decoder)

{
  DecodeStatus DVar1;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 0x20) {
    MCOperand_CreateReg0(Inst,FPR64DecoderTable[RegNo]);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeFPR64RegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Register;

	if (RegNo > 31)
		return Fail;

	Register = FPR64DecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return Success;
}